

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

void absl::lts_20250127::StrAppend<>
               (Nonnull<std::string_*> dest,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d,
               AlphaNum *e)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string_view local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  Nonnull<std::string_*> local_48;
  undefined8 local_40;
  AlphaNum *local_38;
  AlphaNum *e_local;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  Nonnull<std::string_*> dest_local;
  
  local_38 = e;
  e_local = d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = (AlphaNum *)dest;
  local_98 = AlphaNum::Piece(a);
  local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              )AlphaNum::Piece(c_local);
  local_78 = AlphaNum::Piece(d_local);
  local_68 = AlphaNum::Piece(e_local);
  local_58 = AlphaNum::Piece(local_38);
  local_48 = (Nonnull<std::string_*>)&local_98;
  local_40 = 5;
  pieces._M_len = (size_type)c;
  pieces._M_array = (iterator)0x5;
  strings_internal::AppendPieces((strings_internal *)dest,local_48,pieces);
  return;
}

Assistant:

inline void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a,
                      const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
                      const AlphaNum& e, const AV&... args) {
  strings_internal::AppendPieces(
      dest, {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
             static_cast<const AlphaNum&>(args).Piece()...});
}